

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

void ntru_decode(NTRUEncodeSchedule *sched,uint16_t *rs_out,ptrlen data)

{
  long lVar1;
  long lVar2;
  byte *pbVar3;
  ushort uVar4;
  size_t factor1;
  uint32_t *puVar5;
  uint uVar6;
  void *b;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  void *pvVar14;
  
  pvVar7 = data.ptr;
  factor1 = sched->nvals;
  pvVar14 = (void *)(data.len + (long)pvVar7);
  b = safemalloc(factor1,4,0);
  uVar9 = sched->endpos;
  *(undefined4 *)((long)b + uVar9 * 4) = 0;
  sVar12 = sched->nops;
  uVar8 = uVar9;
  if (sVar12 != 0) {
    puVar5 = sched->ops;
    lVar1 = factor1 - 1;
    do {
      uVar4 = (ushort)puVar5[sVar12 - 1];
      if (uVar4 == 0) {
        lVar2 = uVar8 * 4;
        uVar8 = (uVar8 + lVar1) % factor1;
        uVar9 = (uVar9 + lVar1) % factor1;
        *(undefined4 *)((long)b + uVar9 * 4) = *(undefined4 *)((long)b + lVar2);
      }
      else if (uVar4 == 1) {
        if (pvVar14 <= pvVar7) {
          __assert_fail("pos > base",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c"
                        ,0x33b,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
        }
        pbVar3 = (byte *)((long)pvVar14 - 1);
        pvVar14 = (void *)((long)pvVar14 - 1);
        *(uint *)((long)b + uVar8 * 4) = *(int *)((long)b + uVar8 * 4) << 8 | (uint)*pbVar3;
      }
      else {
        uVar10 = *(uint *)((long)b + uVar8 * 4);
        uVar8 = (uVar8 + lVar1) % factor1;
        uVar13 = uVar4 - 2 & 0xffff;
        uVar6 = (uint)(ushort)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) /
                                      ZEXT416(uVar13),0) * (ulong)uVar10 >> 0x30);
        uVar10 = uVar10 - uVar6 * uVar13;
        uVar11 = ((uint)uVar4 + ~uVar10) - 2 >> 0xf & 1;
        uVar9 = (uVar9 + lVar1) % factor1;
        *(uint *)((long)b + uVar9 * 4) = uVar11 + uVar6;
        uVar9 = (uVar9 + lVar1) % factor1;
        *(uint *)((long)b + uVar9 * 4) = uVar10 - uVar13 * uVar11 & 0xffff;
      }
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
  }
  if (pvVar14 != pvVar7) {
    __assert_fail("pos == base",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x35a,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
  }
  if (uVar9 != 0) {
    __assert_fail("head == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x35b,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
  }
  if (uVar8 != factor1 - 1) {
    __assert_fail("tail == n-1",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x35c,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
  }
  if (factor1 != 0) {
    sVar12 = 0;
    do {
      rs_out[sVar12] = *(uint16_t *)((long)b + sVar12 * 4);
      sVar12 = sVar12 + 1;
    } while (factor1 != sVar12);
  }
  smemclr(b,factor1 << 2);
  safefree(b);
  return;
}

Assistant:

void ntru_decode(NTRUEncodeSchedule *sched, uint16_t *rs_out, ptrlen data)
{
    size_t n = sched->nvals;
    const uint8_t *base = (const uint8_t *)data.ptr;
    const uint8_t *pos = base + data.len;

    /*
     * Initialise the queue to a single zero, at the 'endpos' position
     * that will mean the final output is correctly aligned.
     *
     * 'head' and 'tail' have the same meanings as in encoding. So
     * 'tail' is the location that BYTE modifies and COPY and COMBINE
     * consume from, and 'head' is the location that COPY and COMBINE
     * push on to. As in encoding, they both point at the extremal
     * full slots in the array.
     */
    uint32_t *rs = snewn(n, uint32_t);
    size_t head = sched->endpos, tail = head;
    rs[tail] = 0;

    for (size_t i = sched->nops; i-- > 0 ;) {
        uint16_t op = sched->ops[i];
        switch (op) {
          case ENC_BYTE: {
            assert(pos > base);
            uint8_t byte = *--pos;
            rs[tail] = (rs[tail] << 8) | byte;
            break;
          }
          case ENC_COPY: {
            uint32_t r = rs[tail];
            tail = (tail + n - 1) % n;
            head = (head + n - 1) % n;
            rs[head] = r;
            break;
          }
          default: {
            uint32_t r = rs[tail];
            tail = (tail + n - 1) % n;

            uint32_t m = op - ENC_COMBINE_BASE;
            uint64_t mrecip = reciprocal_for_reduction(m);

            uint32_t r1, r2;
            r1 = reduce_with_quot(r, &r2, m, mrecip);

            head = (head + n - 1) % n;
            rs[head] = r2;
            head = (head + n - 1) % n;
            rs[head] = r1;
            break;
          }
        }
    }

    assert(pos == base);
    assert(head == 0);
    assert(tail == n-1);

    for (size_t i = 0; i < n; i++)
        rs_out[i] = rs[i];
    smemclr(rs, n * sizeof(*rs));
    sfree(rs);
}